

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
          (ValidationContext *this,IssueWarning *issue,uint *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  basic_string_view<char,_std::char_traits<char>_> s_00;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  underlying_type_t<ktx::ReturnCode> uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  ValidationReport *this_00;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  *paVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  ValidationReport *in_stack_fffffffffffffcb8;
  ValidationReport *__args;
  ValidationReport *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  undefined1 *puVar4;
  char *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_2d9;
  undefined1 local_2d8;
  undefined2 local_2d6;
  undefined1 local_2d0 [32];
  undefined1 auStack_2b0 [71];
  undefined1 local_269 [41];
  undefined1 auStack_240 [32];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 *local_208;
  undefined1 local_1f8 [48];
  undefined8 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  ValidationReport *local_180;
  undefined1 local_178 [56];
  undefined8 local_140;
  undefined1 *local_138;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  string sStack_100;
  undefined8 *local_e0;
  unsigned_long_long in_stack_ffffffffffffff28;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_ffffffffffffff30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  char *in_stack_ffffffffffffff38;
  char *pcVar6;
  size_t in_stack_ffffffffffffff40;
  
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  local_220 = in_R8;
  local_218 = in_RCX;
  local_210 = in_RDX;
  local_208 = in_RSI;
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    this_00 = (ValidationReport *)(in_RDI + 8);
    local_2d8 = *in_RSI;
    local_2d6 = *(undefined2 *)(in_RSI + 2);
    puVar4 = local_2d0;
    pcVar2 = in_RSI + 8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    __args = (ValidationReport *)auStack_2b0;
    paVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              *)(local_208 + 0x18);
    aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
             )paVar3->values_;
    pcVar6 = *(char **)(local_208 + 0x20);
    s_00._M_str = pcVar2;
    s_00._M_len = (size_t)puVar4;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)this_00,s_00);
    local_198 = local_210;
    local_1a0 = local_218;
    local_1a8 = local_220;
    local_180 = __args;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,std::__cxx11::string,std::__cxx11::string>
              ((uint *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8
              );
    local_1c0 = local_1f8;
    local_1c8 = 0xdd2;
    fmt_00.size_ = (size_t)paVar3;
    fmt_00.data_ = pcVar6;
    args_01.field_1.values_ = aVar5.values_;
    args_01.desc_ = in_stack_ffffffffffffff28;
    ::fmt::v10::vformat_abi_cxx11_(fmt_00,args_01);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)this_00,__args);
    ValidationReport::~ValidationReport(this_00);
    std::allocator<char>::~allocator(&local_2d9);
  }
  else {
    uVar1 = ktx::operator+(SUCCESS);
    *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
    args_2_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
    local_269[1] = 1;
    local_269._3_2_ = *(undefined2 *)(local_208 + 2);
    args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_269 + 9)
    ;
    __t = (basic_string_view<char,_std::char_traits<char>_> *)(local_208 + 8);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_01,__t,(allocator<char> *)args_1_00);
    local_e0 = (undefined8 *)(local_208 + 0x18);
    puVar4 = auStack_2b0 + 0x20;
    sStack_100.field_2._M_allocated_capacity = *local_e0;
    sStack_100.field_2._8_8_ = *(undefined8 *)(local_208 + 0x20);
    s._M_str = in_stack_fffffffffffffcd0;
    s._M_len = in_stack_fffffffffffffcc8;
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffcc0,s);
    local_108 = auStack_2b0._32_8_;
    sStack_100._0_8_ = auStack_2b0._40_8_;
    local_110 = local_210;
    local_118 = local_218;
    local_120 = local_220;
    sStack_100._M_string_length = (size_type)auStack_240;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,std::__cxx11::string,std::__cxx11::string>
              ((uint *)__t,args_1_00,args_2_00);
    local_138 = local_178;
    local_140 = 0xdd2;
    fmt.size_ = in_stack_ffffffffffffff40;
    fmt.data_ = in_stack_ffffffffffffff38;
    args_00.field_1.values_ = in_stack_ffffffffffffff30.values_;
    args_00.desc_ = (unsigned_long_long)puVar4;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
    std::function<void_(const_ktx::ValidationReport_&)>::operator()
              ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
    ValidationReport::~ValidationReport(in_stack_fffffffffffffcc0);
    std::allocator<char>::~allocator((allocator<char> *)local_269);
  }
  return;
}

Assistant:

void warning(const IssueWarning& issue, Args&&... args) {
        ++numWarning;
        if (treatWarningsAsError) {
            returnCode = +rc::INVALID_FILE;
            callback(ValidationReport{IssueType::error, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});

        } else {
            callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
        }
    }